

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::CallForVersion::~CallForVersion(CallForVersion *this)

{
  void *in_RDI;
  
  ~CallForVersion((CallForVersion *)0x3ac0b8);
  operator_delete(in_RDI,0x38);
  return;
}

Assistant:

CallForVersion()
        : CallForVersion("This should be caught in your main function, see examples", ExitCodes::Success) {}